

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::MonochromeRealtimeTest_TestMonochromeEncoding_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::MonochromeRealtimeTest_TestMonochromeEncoding_Test>
             *this)

{
  MonochromeTest *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int>>::
  parameter_ = &this->parameter_;
  this_00 = (MonochromeTest *)operator_new(0x418);
  anon_unknown.dwarf_191e68f::MonochromeTest::MonochromeTest(this_00);
  (this_00->super_CodecTestWith3Params<libaom_test::TestMode,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__MonochromeTest_01044c50;
  (this_00->super_CodecTestWith3Params<libaom_test::TestMode,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__MonochromeRealtimeTest_TestMonochromeEncoding_Test_01044ca8;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__MonochromeRealtimeTest_TestMonochromeEncoding_Test_01044cc8;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }